

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Logging.cpp
# Opt level: O2

void __thiscall
RenX_LoggingPlugin::RenX_OnVehicleSpawn
          (RenX_LoggingPlugin *this,Server *server,TeamType *team,string_view vehicle)

{
  undefined8 uVar1;
  undefined8 uVar2;
  TeamType TVar3;
  undefined1 auVar4 [16];
  string msg;
  undefined8 local_68;
  long local_60;
  code *local_48;
  size_t local_40;
  char *local_38;
  
  local_38 = vehicle._M_str;
  local_40 = vehicle._M_len;
  if ((*(ulong *)&this->field_0xa0 >> 0x23 & 1) == 0) {
    local_48 = RenX::Server::sendAdmChan;
  }
  else {
    local_48 = RenX::Server::sendLogChan;
  }
  std::__cxx11::string::string((string *)&local_68,&this->vehicleSpawnFmt);
  if (local_60 != 0) {
    TVar3 = RenX::getEnemy(*team);
    RenX::processTags((string *)&local_68,server,(PlayerInfo *)0x0,(PlayerInfo *)0x0,
                      (BuildingInfo *)0x0);
    uVar1 = *(undefined8 *)(RenX::tags + 0x3a8);
    uVar2 = *(undefined8 *)(RenX::tags + 0x3b0);
    auVar4 = RenX::getTeamColor(*team);
    RenX::replace_tag(&local_68,uVar2,uVar1,auVar4._0_8_,auVar4._8_8_);
    uVar1 = *(undefined8 *)(RenX::tags + 0x3c8);
    uVar2 = *(undefined8 *)(RenX::tags + 0x3d0);
    auVar4 = RenX::getTeamName(*team);
    RenX::replace_tag(&local_68,uVar2,uVar1,auVar4._0_8_,auVar4._8_8_);
    uVar1 = *(undefined8 *)(RenX::tags + 1000);
    uVar2 = *(undefined8 *)(RenX::tags + 0x3f0);
    auVar4 = RenX::getFullTeamName(*team);
    RenX::replace_tag(&local_68,uVar2,uVar1,auVar4._0_8_,auVar4._8_8_);
    uVar1 = *(undefined8 *)(RenX::tags + 0xa08);
    uVar2 = *(undefined8 *)(RenX::tags + 0xa10);
    auVar4 = RenX::getTeamColor(TVar3);
    RenX::replace_tag(&local_68,uVar2,uVar1,auVar4._0_8_,auVar4._8_8_);
    uVar1 = *(undefined8 *)(RenX::tags + 0xa28);
    uVar2 = *(undefined8 *)(RenX::tags + 0xa30);
    auVar4 = RenX::getTeamName(TVar3);
    RenX::replace_tag(&local_68,uVar2,uVar1,auVar4._0_8_,auVar4._8_8_);
    uVar1 = *(undefined8 *)(RenX::tags + 0xa48);
    uVar2 = *(undefined8 *)(RenX::tags + 0xa50);
    auVar4 = RenX::getFullTeamName(TVar3);
    RenX::replace_tag(&local_68,uVar2,uVar1,auVar4._0_8_,auVar4._8_8_);
    uVar1 = *(undefined8 *)(RenX::tags + 0x328);
    uVar2 = *(undefined8 *)(RenX::tags + 0x330);
    auVar4 = RenX::translateName(local_40,local_38);
    RenX::replace_tag(&local_68,uVar2,uVar1,auVar4._0_8_,auVar4._8_8_);
    (*local_48)(server,local_60,local_68);
  }
  std::__cxx11::string::~string((string *)&local_68);
  return;
}

Assistant:

void RenX_LoggingPlugin::RenX_OnVehicleSpawn(RenX::Server &server, const RenX::TeamType &team, std::string_view vehicle)
{
	logFuncType func;
	if (RenX_LoggingPlugin::vehicleSpawnPublic)
		func = &RenX::Server::sendLogChan;
	else
		func = &RenX::Server::sendAdmChan;

	std::string msg = this->vehicleSpawnFmt;
	if (!msg.empty())
	{
		RenX::TeamType otherTeam = RenX::getEnemy(team);
		RenX::processTags(msg, &server);
		RenX::replace_tag(msg, RenX::tags->INTERNAL_TEAM_COLOR_TAG, RenX::getTeamColor(team));
		RenX::replace_tag(msg, RenX::tags->INTERNAL_TEAM_SHORT_TAG, RenX::getTeamName(team));
		RenX::replace_tag(msg, RenX::tags->INTERNAL_TEAM_LONG_TAG, RenX::getFullTeamName(team));
		RenX::replace_tag(msg, RenX::tags->INTERNAL_VICTIM_TEAM_COLOR_TAG, RenX::getTeamColor(otherTeam));
		RenX::replace_tag(msg, RenX::tags->INTERNAL_VICTIM_TEAM_SHORT_TAG, RenX::getTeamName(otherTeam));
		RenX::replace_tag(msg, RenX::tags->INTERNAL_VICTIM_TEAM_LONG_TAG, RenX::getFullTeamName(otherTeam));
		RenX::replace_tag(msg, RenX::tags->INTERNAL_VEHICLE_TAG, RenX::translateName(vehicle));
		(server.*func)(msg);
	}
}